

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<float>::AdjustResidual(TPZDohrSubstruct<float> *this,TPZFMatrix<float> *r_global)

{
  float fVar1;
  uint uVar2;
  pair<int,_int> *ppVar3;
  TPZMatrix<float> *pTVar4;
  long lVar5;
  float *pfVar6;
  ostream *poVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long rows;
  float local_274;
  TPZFMatrix<float> radjust;
  TPZFMatrix<float> rloc;
  TPZFMatrix<float> radapt;
  TPZFMatrix<float> rint;
  
  rows = (long)this->fNEquations;
  uVar9 = (this->fInternalEqs).fNElements;
  iVar8 = (int)uVar9;
  radapt.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = 0;
  TPZFMatrix<float>::TPZFMatrix(&rint,(long)iVar8,1,(float *)&radapt);
  rloc.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = 0;
  TPZFMatrix<float>::TPZFMatrix(&radapt,rows,1,(float *)&rloc);
  uVar11 = 0;
  uVar9 = uVar9 & 0xffffffff;
  if (iVar8 < 1) {
    uVar9 = uVar11;
  }
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    lVar5 = (long)(this->fGlobalIndex).fStore[(this->fInternalEqs).fStore[uVar11]];
    if (-1 < lVar5) {
      fVar1 = r_global->fElem[lVar5];
      pfVar6 = TPZFMatrix<float>::operator()(&rint,uVar11,0);
      *pfVar6 = fVar1;
    }
  }
  uVar2 = (uint)(this->fGlobalEqs).fNElements;
  uVar10 = 0;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar10;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    ppVar3 = (this->fGlobalEqs).fStore;
    iVar8 = ppVar3[uVar10].first;
    pfVar6 = TPZFMatrix<float>::operator()(r_global,(long)ppVar3[uVar10].second,0);
    fVar1 = *pfVar6;
    pfVar6 = TPZFMatrix<float>::operator()(&radapt,(long)iVar8,0);
    *pfVar6 = fVar1;
  }
  TPZStepSolver<float>::Solve
            (&this->fInvertedInternalStiffness,&rint,&this->fAdjustSolution,(TPZFMatrix<float> *)0x0
            );
  radjust.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = 0;
  TPZFMatrix<float>::TPZFMatrix(&rloc,rows,1,(float *)&radjust);
  local_274 = 0.0;
  TPZFMatrix<float>::TPZFMatrix(&radjust,rows,1,&local_274);
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pfVar6 = TPZFMatrix<float>::operator()(&this->fAdjustSolution,uVar10,0);
    fVar1 = *pfVar6;
    pfVar6 = TPZFMatrix<float>::operator()(&rloc,(long)(this->fInternalEqs).fStore[uVar10],0);
    *pfVar6 = fVar1;
  }
  pTVar4 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
            (0xbf800000,0x3f800000,pTVar4,&rloc,&radapt,&radjust,0);
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pfVar6 = TPZFMatrix<float>::operator()(&radjust,(long)(this->fInternalEqs).fStore[uVar10],0);
    if (1e-10 <= ABS(*pfVar6)) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Internal node ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar10);
      poVar7 = std::operator<<(poVar7," was not zeroed ");
      pfVar6 = TPZFMatrix<float>::operator()(&radjust,(long)(this->fInternalEqs).fStore[uVar10],0);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pfVar6);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    pfVar6 = TPZFMatrix<float>::operator()(&radjust,(long)(this->fInternalEqs).fStore[uVar10],0);
    *pfVar6 = 0.0;
  }
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    ppVar3 = (this->fGlobalEqs).fStore;
    iVar8 = ppVar3[uVar9].second;
    pfVar6 = TPZFMatrix<float>::operator()(&radjust,(long)ppVar3[uVar9].first,0);
    fVar1 = *pfVar6;
    pfVar6 = TPZFMatrix<float>::operator()(r_global,(long)iVar8,0);
    *pfVar6 = fVar1;
  }
  TPZFMatrix<float>::~TPZFMatrix(&radjust);
  TPZFMatrix<float>::~TPZFMatrix(&rloc);
  TPZFMatrix<float>::~TPZFMatrix(&radapt);
  TPZFMatrix<float>::~TPZFMatrix(&rint);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::AdjustResidual(TPZFMatrix<TVar> &r_global)
{
	int nglob = fNEquations;
	int nint = this->fInternalEqs.NElements();
	TPZFMatrix<TVar> rint(nint,1,0.),radapt(nglob,1,0.);
	int i;
	for(i=0; i<nint; i++)
	{
		if(fGlobalIndex[fInternalEqs[i]] >= 0)
		{
			rint(i,0) = r_global(fGlobalIndex[fInternalEqs[i]]);
		}
	}
	
	// initializar radapt com zero
	int neqs = fGlobalEqs.NElements();
	for(i=0; i<neqs; i++)
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		radapt(ind.first,0) = r_global(ind.second,0);
	}
	fInvertedInternalStiffness.Solve(rint,fAdjustSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Adjusted internal solution";
		fAdjustSolution.Print("fAdjustSolution",sout);
		rint.Print("Internal residual",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	TPZFMatrix<TVar> rloc(nglob,1,0.),radjust(nglob,1,0.);
	for(i=0; i<nint; i++)
	{
		rloc(fInternalEqs[i],0) = fAdjustSolution(i,0);
	}
	fStiffness->MultAdd(rloc,radapt,radjust,-1.,1.);
	for(i=0; i<nint; i++)
	{
		if(fabs(radjust(fInternalEqs[i],0)) >= 1.e-10)
		{
			std::cout << "Internal node " << i << " was not zeroed " << radjust(fInternalEqs[i],0) << std::endl;
		}
		radjust(fInternalEqs[i],0) = 0.;
	}
	
	// somar a contribuicao no r_global (tarefa)
	for(i=0; i<neqs; i++)
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		r_global(ind.second,0) = radjust(ind.first,0);
	}
}